

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall
QRasterPaintEngine::drawTiledPixmap(QRasterPaintEngine *this,QRectF *r,QPixmap *pixmap,QPointF *sr)

{
  ClassId CVar1;
  int iVar2;
  TransformationType TVar3;
  QRasterPaintEnginePrivate *pQVar4;
  QRasterPaintEngineState *pQVar5;
  QPlatformPixmap *this_00;
  QClipData *pQVar6;
  QRasterizer *this_01;
  QPointF *in_RCX;
  QRectF *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  qreal qVar7;
  qreal qVar8;
  double dVar9;
  QRectF *rect;
  qreal inverseDpr;
  qreal pixmapDevicePixelRatio;
  QPlatformPixmap *pd;
  QRasterPaintEngineState *s;
  QRasterPaintEnginePrivate *d;
  QRectF rr;
  QPainterPath path;
  QPointF b;
  QPointF a;
  QImage image;
  QTransform copy;
  QPixmap *in_stack_fffffffffffffcf8;
  QImage *in_stack_fffffffffffffd00;
  QRasterPaintEnginePrivate *in_stack_fffffffffffffd08;
  QImage *in_stack_fffffffffffffd10;
  QRect *in_stack_fffffffffffffd18;
  QSpanData *in_stack_fffffffffffffd20;
  QRasterPaintEnginePrivate *in_stack_fffffffffffffd28;
  QRectF *this_02;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  QColor *in_stack_fffffffffffffd40;
  QImage *in_stack_fffffffffffffd48;
  QRasterBuffer *in_stack_fffffffffffffd50;
  QPainterPath *in_stack_fffffffffffffd58;
  QRasterPaintEnginePrivate *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  QRasterBuffer *in_stack_fffffffffffffd98;
  QRectF local_1d0;
  undefined1 *local_1a0;
  double local_198;
  QPointF local_190;
  QPointF local_180;
  QPointF local_170;
  QPointF local_160;
  QPointF local_150;
  QPointF local_140;
  QPointF local_130;
  QPointF local_120;
  QPointF local_110;
  QPointF local_100;
  QRectF local_f0;
  QColor local_c0;
  undefined1 local_80 [16];
  QImageData *local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined2 local_5c;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QRasterPaintEngine *)0x56f4a1);
  pQVar5 = state((QRasterPaintEngine *)0x56f4b6);
  local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage(in_stack_fffffffffffffd00);
  this_00 = QPixmap::handle((QPixmap *)0x56f505);
  CVar1 = QPlatformPixmap::classId(this_00);
  if (CVar1 == RasterClass) {
    QImage::operator=(in_stack_fffffffffffffd10,(QImage *)in_stack_fffffffffffffd08);
  }
  else {
    QPixmap::toImage((QPixmap *)in_stack_fffffffffffffd08);
    QImage::operator=((QImage *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    QImage::~QImage(in_stack_fffffffffffffd00);
  }
  iVar2 = QImage::depth((QImage *)local_80);
  if (iVar2 == 1) {
    in_stack_fffffffffffffd98 =
         QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::operator->
                   (&pQVar4->rasterBuffer);
    local_c0 = QPen::color((QPen *)in_stack_fffffffffffffd08);
    local_68 = local_c0._0_8_;
    local_60 = local_c0.ct._4_4_;
    local_5c = local_c0.ct._8_2_;
    QRasterBuffer::colorizeBitmap
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    QImage::operator=((QImage *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    QImage::~QImage(in_stack_fffffffffffffd00);
  }
  qVar7 = QPixmap::devicePixelRatio(in_stack_fffffffffffffcf8);
  TVar3 = QTransform::type((QTransform *)in_stack_fffffffffffffd08);
  if ((1 < (int)TVar3) || (1.0 < qVar7)) {
    memcpy(local_58,&DAT_00bb9958,0x50);
    memcpy(local_58,&(pQVar5->super_QPainterState).matrix,0x50);
    QRectF::x(in_RSI);
    QRectF::y(in_RSI);
    QTransform::translate
              ((QTransform *)in_stack_fffffffffffffd18,(qreal)in_stack_fffffffffffffd10,
               (qreal)in_stack_fffffffffffffd08);
    QPointF::x(in_RCX);
    QPointF::y(in_RCX);
    QTransform::translate
              ((QTransform *)in_stack_fffffffffffffd18,(qreal)in_stack_fffffffffffffd10,
               (qreal)in_stack_fffffffffffffd08);
    QTransform::scale((QTransform *)in_stack_fffffffffffffd18,(qreal)in_stack_fffffffffffffd10,
                      (qreal)in_stack_fffffffffffffd08);
    pQVar6 = QRasterPaintEnginePrivate::clip(in_stack_fffffffffffffd08);
    (pQVar4->image_filler_xform).clip = pQVar6;
    QRect::QRect((QRect *)in_stack_fffffffffffffd00);
    QSpanData::initTexture
              ((QSpanData *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (QImage *)in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
               (Type)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    if ((pQVar4->image_filler_xform).blend != (ProcessSpans)0x0) {
      QSpanData::setupMatrix
                ((QSpanData *)in_stack_fffffffffffffd28,(QTransform *)in_stack_fffffffffffffd20,
                 (int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      ensureRasterState((QRasterPaintEngine *)in_stack_fffffffffffffd00);
      if (((*(ushort *)&pQVar5->field_12 >> 6 & 1) == 0) &&
         (TVar3 = QTransform::type((QTransform *)in_stack_fffffffffffffd08), TVar3 != TxScale)) {
        local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
        QPainterPath::QPainterPath((QPainterPath *)0x56fc89);
        QPainterPath::addRect(in_stack_fffffffffffffd58,(QRectF *)in_stack_fffffffffffffd50);
        (**(code **)(*in_RDI + 0x1b0))(in_RDI,&local_1a0,&pQVar4->image_filler_xform);
        QPainterPath::~QPainterPath((QPainterPath *)0x56fcd3);
      }
      else {
        QRasterPaintEnginePrivate::initializeRasterizer
                  (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
        this_01 = QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                            (&pQVar4->rasterizer);
        QRasterizer::setAntialiased(this_01,(*(ushort *)&pQVar5->field_12 >> 3 & 1) != 0);
        QRectF::normalized();
        local_100.yp = -NAN;
        local_100.xp = -NAN;
        local_130 = QRectF::topLeft((QRectF *)in_stack_fffffffffffffd08);
        local_140 = QRectF::bottomLeft((QRectF *)in_stack_fffffffffffffd08);
        local_120 = ::operator+((QPointF *)in_stack_fffffffffffffd08,
                                (QPointF *)in_stack_fffffffffffffd00);
        local_110 = ::operator*((QPointF *)in_stack_fffffffffffffd08,
                                (qreal)in_stack_fffffffffffffd00);
        local_100 = QTransform::map((QTransform *)in_stack_fffffffffffffd28,
                                    (QPointF *)in_stack_fffffffffffffd20);
        local_150.yp = -NAN;
        local_150.xp = -NAN;
        local_180 = QRectF::topRight((QRectF *)in_stack_fffffffffffffd08);
        local_190 = QRectF::bottomRight((QRectF *)in_stack_fffffffffffffd08);
        local_170 = ::operator+((QPointF *)in_stack_fffffffffffffd08,
                                (QPointF *)in_stack_fffffffffffffd00);
        local_160 = ::operator*((QPointF *)in_stack_fffffffffffffd08,
                                (qreal)in_stack_fffffffffffffd00);
        local_150 = QTransform::map((QTransform *)in_stack_fffffffffffffd28,
                                    (QPointF *)in_stack_fffffffffffffd20);
        if ((*(ushort *)&pQVar5->field_12 >> 6 & 1) == 0) {
          QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                    (&pQVar4->rasterizer);
          qVar7 = QTransform::m22(&(pQVar5->super_QPainterState).matrix);
          qVar8 = QRectF::height(&local_f0);
          dVar9 = qVar7 * qVar8;
          qVar7 = QTransform::m11(&(pQVar5->super_QPainterState).matrix);
          qVar8 = QRectF::width(&local_f0);
          local_198 = dVar9 / (qVar7 * qVar8);
          qAbs<double>(&local_198);
          QRasterizer::rasterizeLine((QRasterizer *)r,(QPointF *)pixmap,sr,(qreal)d,s._7_1_);
        }
        else {
          QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                    (&pQVar4->rasterizer);
          QRectF::height(&local_f0);
          QRectF::width(&local_f0);
          QRasterizer::rasterizeLine((QRasterizer *)r,(QPointF *)pixmap,sr,(qreal)d,s._7_1_);
        }
      }
    }
  }
  else {
    pQVar6 = QRasterPaintEnginePrivate::clip(in_stack_fffffffffffffd08);
    (pQVar4->image_filler).clip = pQVar6;
    this_02 = (QRectF *)&pQVar4->image_filler;
    iVar2 = pQVar5->intOpacity;
    QRect::QRect((QRect *)in_stack_fffffffffffffd00);
    QSpanData::initTexture
              ((QSpanData *)CONCAT44(iVar2,in_stack_fffffffffffffd30),(QImage *)this_02,
               (int)((ulong)in_stack_fffffffffffffd20 >> 0x20),(Type)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18);
    if ((pQVar4->image_filler).blend != (ProcessSpans)0x0) {
      in_stack_fffffffffffffd00 = (QImage *)QRectF::x(in_RSI);
      qVar7 = QTransform::dx(&(pQVar5->super_QPainterState).matrix);
      dVar9 = -((double)in_stack_fffffffffffffd00 + qVar7);
      qVar7 = QPointF::x(in_RCX);
      (pQVar4->image_filler).dx = dVar9 + qVar7;
      qVar7 = QRectF::y(in_RSI);
      qVar8 = QTransform::dy(&(pQVar5->super_QPainterState).matrix);
      dVar9 = -(qVar7 + qVar8);
      qVar7 = QPointF::y(in_RCX);
      (pQVar4->image_filler).dy = dVar9 + qVar7;
      local_1d0.xp = in_RSI->xp;
      local_1d0.yp = in_RSI->yp;
      local_1d0.w = in_RSI->w;
      local_1d0.h = in_RSI->h;
      qVar7 = QTransform::dx(&(pQVar5->super_QPainterState).matrix);
      qVar8 = QTransform::dy(&(pQVar5->super_QPainterState).matrix);
      QRectF::translate(&local_1d0,qVar7,qVar8);
      QRectF::normalized();
      QRectF::toRect(this_02);
      fillRect_normalized((QRect *)in_stack_fffffffffffffd98,
                          (QSpanData *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                          ,in_stack_fffffffffffffd88);
    }
  }
  QImage::~QImage(in_stack_fffffffffffffd00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRasterPaintEngine::drawTiledPixmap(const QRectF &r, const QPixmap &pixmap, const QPointF &sr)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " - QRasterPaintEngine::drawTiledPixmap(), r=" << r << "pixmap=" << pixmap.size();
#endif
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();
    Q_ASSERT(s);

    QImage image;

    QPlatformPixmap *pd = pixmap.handle();
    if (pd->classId() == QPlatformPixmap::RasterClass) {
        image = static_cast<QRasterPlatformPixmap *>(pd)->image;
    } else {
        image = pixmap.toImage();
    }

    if (image.depth() == 1)
        image = d->rasterBuffer->colorizeBitmap(image, s->pen.color());

    const qreal pixmapDevicePixelRatio = pixmap.devicePixelRatio();
    if (s->matrix.type() > QTransform::TxTranslate || pixmapDevicePixelRatio > qreal(1.0)) {
        QTransform copy = s->matrix;
        copy.translate(r.x(), r.y());
        copy.translate(-sr.x(), -sr.y());
        const qreal inverseDpr = qreal(1.0) / pixmapDevicePixelRatio;
        copy.scale(inverseDpr, inverseDpr);
        d->image_filler_xform.clip = d->clip();
        d->image_filler_xform.initTexture(&image, s->intOpacity, QTextureData::Tiled);
        if (!d->image_filler_xform.blend)
            return;
        d->image_filler_xform.setupMatrix(copy, s->flags.bilinear);

#ifdef QT_FAST_SPANS
        ensureRasterState();
        if (s->flags.tx_noshear || s->matrix.type() == QTransform::TxScale) {
            d->initializeRasterizer(&d->image_filler_xform);
            d->rasterizer->setAntialiased(s->flags.antialiased);

            const QRectF &rect = r.normalized();
            const QPointF a = s->matrix.map((rect.topLeft() + rect.bottomLeft()) * 0.5f);
            const QPointF b = s->matrix.map((rect.topRight() + rect.bottomRight()) * 0.5f);
            if (s->flags.tx_noshear)
                d->rasterizer->rasterizeLine(a, b, rect.height() / rect.width());
            else
                d->rasterizer->rasterizeLine(a, b, qAbs((s->matrix.m22() * rect.height()) / (s->matrix.m11() * rect.width())));
            return;
        }
#endif
        QPainterPath path;
        path.addRect(r);
        fillPath(path, &d->image_filler_xform);
    } else {
        d->image_filler.clip = d->clip();

        d->image_filler.initTexture(&image, s->intOpacity, QTextureData::Tiled);
        if (!d->image_filler.blend)
            return;
        d->image_filler.dx = -(r.x() + s->matrix.dx()) + sr.x();
        d->image_filler.dy = -(r.y() + s->matrix.dy()) + sr.y();

        QRectF rr = r;
        rr.translate(s->matrix.dx(), s->matrix.dy());
        fillRect_normalized(rr.normalized().toRect(), &d->image_filler, d);
    }
}